

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_utf8_exception.cpp
# Opt level: O3

void __thiscall
argo::json_utf8_exception::json_utf8_exception
          (json_utf8_exception *this,exception_type et,string *s)

{
  uint uVar1;
  char *pcVar2;
  
  json_exception::json_exception(&this->super_json_exception,et);
  *(undefined ***)&this->super_json_exception = &PTR__exception_00128b68;
  this->m_byte_index = 0;
  uVar1 = (this->super_json_exception).m_type - invalid_string_escape_e;
  if (uVar1 < 7) {
    pcVar2 = (&PTR_anon_var_dwarf_55c48_00128c08)[uVar1];
  }
  else {
    pcVar2 = "generic";
  }
  snprintf((this->super_json_exception).m_message,200,"%s : %s",pcVar2,(s->_M_dataplus)._M_p);
  return;
}

Assistant:

json_utf8_exception::json_utf8_exception(exception_type et, const string &s) noexcept :
                    json_exception(et), m_byte_index(0)
{
    snprintf(m_message, max_message_length, "%s : %s", get_main_message(), s.c_str());
}